

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.cpp
# Opt level: O2

void __thiscall SaiTreeView::PrintVirtualFileEntry(SaiTreeView *this,VirtualFileEntry *Entry)

{
  tm *__tp;
  size_t sVar1;
  char *pcVar2;
  time_t TimeStamp;
  char TimeString [32];
  
  TimeStamp = sai::VirtualFileEntry::GetTimeStamp(Entry);
  __tp = localtime(&TimeStamp);
  strftime(TimeString,0x20,"%D %R",__tp);
  PrintNestedFolder(this);
  sVar1 = sai::VirtualFileEntry::GetSize(Entry);
  pcVar2 = sai::VirtualFileEntry::GetName(Entry);
  printf(anon_var_dwarf_3749,sVar1,TimeString,pcVar2);
  return;
}

Assistant:

void PrintVirtualFileEntry(const sai::VirtualFileEntry& Entry) const
	{
		const std::time_t TimeStamp = Entry.GetTimeStamp();
		char              TimeString[32];
		std::strftime(TimeString, 32, "%D %R", std::localtime(&TimeStamp));
		PrintNestedFolder();
		std::printf(
			"\u251C\u2500\u2500 [%12zu %s] %s\n", Entry.GetSize(), TimeString, Entry.GetName()
		);
	}